

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

CoeffReturnType __thiscall
Eigen::internal::
unary_evaluator<Eigen::Replicate<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1>,_Eigen::internal::IndexBased,_double>
::coeff(unary_evaluator<Eigen::Replicate<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1>,_Eigen::internal::IndexBased,_double>
        *this,Index row,Index col)

{
  long lVar1;
  CoeffReturnType pdVar2;
  long in_RDX;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *this_00;
  long in_RSI;
  long in_RDI;
  Index actual_col;
  Index actual_row;
  
  lVar1 = variable_if_dynamic<long,_-1>::value((variable_if_dynamic<long,__1> *)(in_RDI + 0x18));
  this_00 = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
            (in_RSI % lVar1);
  lVar1 = variable_if_dynamic<long,_-1>::value((variable_if_dynamic<long,__1> *)(in_RDI + 0x20));
  pdVar2 = evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::coeff
                     (this_00,in_RDX % lVar1,in_RDX);
  return *pdVar2;
}

Assistant:

CoeffReturnType coeff(Index row, Index col) const
  {
    // try to avoid using modulo; this is a pure optimization strategy
    const Index actual_row = internal::traits<XprType>::RowsAtCompileTime==1 ? 0
                           : RowFactor==1 ? row
                           : row % m_rows.value();
    const Index actual_col = internal::traits<XprType>::ColsAtCompileTime==1 ? 0
                           : ColFactor==1 ? col
                           : col % m_cols.value();
    
    return m_argImpl.coeff(actual_row, actual_col);
  }